

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

ProcessOpenModeResult *
processOpenModeFlags(ProcessOpenModeResult *__return_storage_ptr__,OpenMode openMode)

{
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar1;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QLatin1StringView other;
  qsizetype qStack_50;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->error).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->error).d.size = 0;
  *(undefined8 *)&__return_storage_ptr__->openMode = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->error).d.d + 4) = 0;
  __return_storage_ptr__->ok = false;
  if ((~(uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
              super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0xc0) == 0) {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    pcVar3 = "NewOnly and ExistingOnly are mutually exclusive";
    QMessageLogger::warning(&local_40,"NewOnly and ExistingOnly are mutually exclusive");
    qStack_50 = 0x2f;
  }
  else {
    if (((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
               super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x83) != 0x80) {
      QVar2.i = (uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i | 2;
      if (((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                 super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x44) == 0) {
        QVar2.i = (Int)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
      }
      QVar1.i = QVar2.i | 8;
      if ((QVar2.i & 0x47) != 2) {
        QVar1.i = QVar2.i;
      }
      __return_storage_ptr__->ok = true;
      (__return_storage_ptr__->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = QVar1.i;
      goto LAB_00227fd2;
    }
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    pcVar3 = "ExistingOnly must be specified alongside ReadOnly, WriteOnly, or ReadWrite";
    QMessageLogger::warning
              (&local_40,
               "ExistingOnly must be specified alongside ReadOnly, WriteOnly, or ReadWrite");
    qStack_50 = 0x4a;
  }
  other.m_data = pcVar3;
  other.m_size = qStack_50;
  QString::operator=(&__return_storage_ptr__->error,other);
LAB_00227fd2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProcessOpenModeResult processOpenModeFlags(QIODevice::OpenMode openMode)
{
    ProcessOpenModeResult result;
    result.ok = false;
    if ((openMode & QFile::NewOnly) && (openMode & QFile::ExistingOnly)) {
        qWarning("NewOnly and ExistingOnly are mutually exclusive");
        result.error = "NewOnly and ExistingOnly are mutually exclusive"_L1;
        return result;
    }

    if ((openMode & QFile::ExistingOnly) && !(openMode & (QFile::ReadOnly | QFile::WriteOnly))) {
        qWarning("ExistingOnly must be specified alongside ReadOnly, WriteOnly, or ReadWrite");
        result.error =
                    "ExistingOnly must be specified alongside ReadOnly, WriteOnly, or ReadWrite"_L1;
        return result;
    }

    // Either Append or NewOnly implies WriteOnly
    if (openMode & (QFile::Append | QFile::NewOnly))
        openMode |= QFile::WriteOnly;

    // WriteOnly implies Truncate when ReadOnly, Append, and NewOnly are not set.
    if ((openMode & QFile::WriteOnly) && !(openMode & (QFile::ReadOnly | QFile::Append | QFile::NewOnly)))
        openMode |= QFile::Truncate;

    result.ok = true;
    result.openMode = openMode;
    return result;
}